

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ReplicationExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ReplicationExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange>
          (BumpAllocator *this,Type *args,Expression *args_1,Expression *args_2,SourceRange *args_3)

{
  SourceLocation SVar1;
  SourceLocation SVar2;
  ReplicationExpression *pRVar3;
  
  pRVar3 = (ReplicationExpression *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ReplicationExpression *)this->endPtr < pRVar3 + 1) {
    pRVar3 = (ReplicationExpression *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pRVar3 + 1);
  }
  SVar1 = args_3->startLoc;
  SVar2 = args_3->endLoc;
  (pRVar3->super_Expression).kind = Replication;
  (pRVar3->super_Expression).type.ptr = args;
  (pRVar3->super_Expression).constant = (ConstantValue *)0x0;
  (pRVar3->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pRVar3->super_Expression).sourceRange.startLoc = SVar1;
  (pRVar3->super_Expression).sourceRange.endLoc = SVar2;
  pRVar3->count_ = args_1;
  pRVar3->concat_ = args_2;
  return pRVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }